

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall
QCborStreamReaderPrivate::QCborStreamReaderPrivate(QCborStreamReaderPrivate *this,QIODevice *device)

{
  long in_RDI;
  QIODevice *dev;
  QCborStreamReaderPrivate *this_00;
  
  dev = (QIODevice *)(in_RDI + 8);
  QByteArray::QByteArray((QByteArray *)0x8d94c9);
  this_00 = (QCborStreamReaderPrivate *)(in_RDI + 0x20);
  QStack<CborValue>::QStack((QStack<CborValue> *)0x8d94dc);
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined1 *)(in_RDI + 0x70) = 0;
  setDevice(this_00,dev);
  return;
}

Assistant:

QCborStreamReaderPrivate(QIODevice *device)
    {
        setDevice(device);
    }